

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(long lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  bool bVar2;
  char cVar3;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_SIL;
  long *in_RDI;
  long ret;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  undefined7 in_stack_ffffffffffffffd8;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_stack_ffffffffffffffe0;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  undefined5 in_stack_ffffffffffffffe8;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffef;
  char local_1;
  
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xffffffffffffffef);
  SVar4.m_int = in_SIL.m_int;
  bVar2 = DivisionCornerCaseHelper<char,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
          ::DivisionCornerCase1
                    ((long)in_RDI,in_SIL,
                     (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     &stack0xffffffffffffffef);
  SVar1.m_int = in_stack_ffffffffffffffef.m_int;
  if ((!bVar2) &&
     (bVar2 = DivisionCornerCaseHelper2<char,_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
              ::DivisionCornerCase2
                        (CONCAT17(in_stack_ffffffffffffffef.m_int,
                                  CONCAT16(SVar4.m_int,
                                           CONCAT15(in_SIL.m_int,in_stack_ffffffffffffffe8))),
                         (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                         (char)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffffe0),
     SVar1.m_int = in_stack_ffffffffffffffef.m_int, !bVar2)) {
    this = (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0;
    cVar3 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)0x0);
    DivisionHelper<long,_char,_5>::DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              (in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffef.m_int,
                                       CONCAT16(SVar4.m_int,
                                                CONCAT15(in_SIL.m_int,in_stack_ffffffffffffffe8))),
               (long *)this);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<long>
              (this,(long *)CONCAT17(cVar3,in_stack_ffffffffffffffd8));
    SVar1.m_int = local_1;
  }
  local_1 = SVar1.m_int;
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_1;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}